

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopItemFlag(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  int *piVar3;
  ImGuiItemFlags local_14;
  ImGuiWindow *window;
  
  pIVar2 = GetCurrentWindow();
  ImVector<int>::pop_back(&(pIVar2->DC).ItemFlagsStack);
  bVar1 = ImVector<int>::empty(&(pIVar2->DC).ItemFlagsStack);
  if (bVar1) {
    local_14 = 0;
  }
  else {
    piVar3 = ImVector<int>::back(&(pIVar2->DC).ItemFlagsStack);
    local_14 = *piVar3;
  }
  (pIVar2->DC).ItemFlags = local_14;
  return;
}

Assistant:

void ImGui::PopItemFlag()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ItemFlagsStack.pop_back();
    window->DC.ItemFlags = window->DC.ItemFlagsStack.empty() ? ImGuiItemFlags_Default_ : window->DC.ItemFlagsStack.back();
}